

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

bool __thiscall DataRefs::FetchPAc(DataRefs *this)

{
  LTAircraft *pLVar1;
  iterator iVar2;
  bool bVar3;
  FDKeyTy fdKey;
  string local_38;
  
  if ((this->keyAc)._M_string_length == 0) {
    GetDebugAcFilter_abi_cxx11_((string *)&fdKey,this);
    std::__cxx11::string::operator=((string *)&this->keyAc,(string *)&fdKey);
    std::__cxx11::string::~string((string *)&fdKey);
    if ((this->keyAc)._M_string_length == 0) {
      return false;
    }
  }
  std::__cxx11::string::string((string *)&local_38,(string *)&this->keyAc);
  LTFlightData::FDKeyTy::FDKeyTy(&fdKey,KEY_ICAO,&local_38,0x10);
  std::__cxx11::string::~string((string *)&local_38);
  iVar2 = std::
          _Rb_tree<LTFlightData::FDKeyTy,_std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>,_std::_Select1st<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
          ::find(&mapFd._M_t,&fdKey);
  if ((_Rb_tree_header *)iVar2._M_node == &mapFd._M_t._M_impl.super__Rb_tree_header) {
    this->pAc = (LTAircraft *)0x0;
    (this->keyAc)._M_string_length = 0;
    *(this->keyAc)._M_dataplus._M_p = '\0';
    bVar3 = false;
  }
  else {
    pLVar1 = (LTAircraft *)iVar2._M_node[0x1d]._M_left;
    this->pAc = pLVar1;
    bVar3 = pLVar1 != (LTAircraft *)0x0;
  }
  std::__cxx11::string::~string((string *)&fdKey.key);
  return bVar3;
}

Assistant:

bool DataRefs::FetchPAc ()
{
    // if there is no a/c defined yet, BUT there is a debug a/c defined
    // then we use that debug a/c
    if ( keyAc.empty() )
        keyAc = GetDebugAcFilter();
    
    // short-cut if there is still no key
    if ( keyAc.empty() )
        return false;
    
    // find that key's element
    LTFlightData::FDKeyTy fdKey (LTFlightData::KEY_ICAO, keyAc);
    mapLTFlightDataTy::const_iterator fdIter = mapFd.find(fdKey);
    if (fdIter != mapFd.end()) {
        // found, save ptr to a/c
        pAc = fdIter->second.GetAircraft();
        // that pointer might be NULL if a/c has not yet been created!
        return pAc != nullptr;
    }

    // not found, clear all ptr/keys
    pAc = nullptr;
    keyAc.clear();
    return false;
}